

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::dispatch::Bound_Function::build_param_list
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Bound_Function *this,Function_Params *params)

{
  const_iterator cVar1;
  bool bVar2;
  Boxed_Value *pBVar3;
  reference __x;
  pointer pBVar4;
  Type_Info *pTVar5;
  bool local_d1;
  byte local_b9;
  bool local_a9;
  Type_Info local_90;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_78 [3];
  Type_Info local_60;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_48;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_40;
  undefined1 local_31;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_30;
  const_iterator barg;
  Boxed_Value *parg;
  Function_Params *params_local;
  Bound_Function *this_local;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *args;
  
  barg._M_current = Function_Params::begin(params);
  local_30._M_current =
       (Boxed_Value *)
       std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                 (&this->m_args);
  local_31 = 0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (__return_storage_ptr__);
  while( true ) {
    cVar1._M_current = barg._M_current;
    pBVar3 = Function_Params::end(params);
    local_a9 = false;
    if (cVar1._M_current == pBVar3) {
      local_40._M_current =
           (Boxed_Value *)
           std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                     (&this->m_args);
      local_a9 = __gnu_cxx::
                 operator==<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                           (&local_30,&local_40);
    }
    if (((local_a9 ^ 0xffU) & 1) == 0) break;
    while( true ) {
      local_48._M_current =
           (Boxed_Value *)
           std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                     (&this->m_args);
      bVar2 = __gnu_cxx::
              operator==<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        (&local_30,&local_48);
      local_b9 = 0;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pBVar4 = __gnu_cxx::
                 __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                 ::operator->(&local_30);
        pTVar5 = Boxed_Value::get_type_info(pBVar4);
        chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Placeholder_Object>::get();
        bVar2 = Type_Info::operator==(pTVar5,&local_60);
        local_b9 = bVar2 ^ 0xff;
      }
      cVar1._M_current = barg._M_current;
      if ((local_b9 & 1) == 0) break;
      __x = __gnu_cxx::
            __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
            ::operator*(&local_30);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                (__return_storage_ptr__,__x);
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(&local_30);
    }
    pBVar3 = Function_Params::end(params);
    if (cVar1._M_current != pBVar3) {
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                (__return_storage_ptr__,barg._M_current);
      barg._M_current = barg._M_current + 1;
    }
    local_78[0]._M_current =
         (Boxed_Value *)
         std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                   (&this->m_args);
    bVar2 = __gnu_cxx::
            operator==<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                      (&local_30,local_78);
    local_d1 = false;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pBVar4 = __gnu_cxx::
               __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
               ::operator->(&local_30);
      pTVar5 = Boxed_Value::get_type_info(pBVar4);
      chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Placeholder_Object>::get();
      local_d1 = Type_Info::operator==(pTVar5,&local_90);
    }
    if (local_d1 != false) {
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Boxed_Value> build_param_list(const Function_Params &params) const {
        auto parg = params.begin();
        auto barg = m_args.begin();

        std::vector<Boxed_Value> args;

        while (!(parg == params.end() && barg == m_args.end())) {
          while (barg != m_args.end() && !(barg->get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get())) {
            args.push_back(*barg);
            ++barg;
          }

          if (parg != params.end()) {
            args.push_back(*parg);
            ++parg;
          }

          if (barg != m_args.end() && barg->get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get()) {
            ++barg;
          }
        }
        return args;
      }